

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex.cpp
# Opt level: O2

bool __thiscall TxIndex::CustomAppend(TxIndex *this,BlockInfo *block)

{
  CBlock *pCVar1;
  pointer psVar2;
  bool bVar3;
  size_t sVar4;
  size_type __n;
  shared_ptr<const_CTransaction> *tx;
  pointer psVar5;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> local_78;
  vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_> vPos;
  CDiskTxPos local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (block->height == 0) {
    bVar3 = true;
  }
  else {
    pCVar1 = block->data;
    if (pCVar1 == (CBlock *)0x0) {
      __assert_fail("block.data",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/txindex.cpp"
                    ,0x3e,"virtual bool TxIndex::CustomAppend(const interfaces::BlockInfo &)");
    }
    local_48.super_FlatFilePos.nFile = block->file_number;
    local_48.super_FlatFilePos.nPos = block->data_pos;
    __n = (long)(pCVar1->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pCVar1->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
    if (__n < 0xfd) {
      local_48.nTxOffset = 1;
    }
    else if (__n < 0x10000) {
      local_48.nTxOffset = 3;
    }
    else {
      local_48.nTxOffset = (uint)(__n >> 0x20 != 0) * 4 + 5;
    }
    vPos.
    super__Vector_base<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vPos.
    super__Vector_base<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vPos.
    super__Vector_base<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>::
    reserve(&vPos,__n);
    psVar2 = (block->data->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar5 = (block->data->vtx).
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1)
    {
      std::vector<std::pair<uint256,CDiskTxPos>,std::allocator<std::pair<uint256,CDiskTxPos>>>::
      emplace_back<transaction_identifier<false>const&,CDiskTxPos&>
                ((vector<std::pair<uint256,CDiskTxPos>,std::allocator<std::pair<uint256,CDiskTxPos>>>
                  *)&vPos,&((psVar5->
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->hash,&local_48);
      local_78.m_object =
           (psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_78.m_params = &::TX_WITH_WITNESS;
      sVar4 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>(&local_78);
      local_48.nTxOffset = local_48.nTxOffset + (int)sVar4;
    }
    bVar3 = DB::WriteTxs((this->m_db)._M_t.
                         super___uniq_ptr_impl<TxIndex::DB,_std::default_delete<TxIndex::DB>_>._M_t.
                         super__Tuple_impl<0UL,_TxIndex::DB_*,_std::default_delete<TxIndex::DB>_>.
                         super__Head_base<0UL,_TxIndex::DB_*,_false>._M_head_impl,&vPos);
    std::
    _Vector_base<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>::
    ~_Vector_base(&vPos.
                   super__Vector_base<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool TxIndex::CustomAppend(const interfaces::BlockInfo& block)
{
    // Exclude genesis block transaction because outputs are not spendable.
    if (block.height == 0) return true;

    assert(block.data);
    CDiskTxPos pos({block.file_number, block.data_pos}, GetSizeOfCompactSize(block.data->vtx.size()));
    std::vector<std::pair<uint256, CDiskTxPos>> vPos;
    vPos.reserve(block.data->vtx.size());
    for (const auto& tx : block.data->vtx) {
        vPos.emplace_back(tx->GetHash(), pos);
        pos.nTxOffset += ::GetSerializeSize(TX_WITH_WITNESS(*tx));
    }
    return m_db->WriteTxs(vPos);
}